

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFragmentOpUtil.cpp
# Opt level: O0

void __thiscall deqp::gls::FragmentOpUtil::QuadRenderer::render(QuadRenderer *this,Quad *quad)

{
  code *pcVar1;
  RenderContext *context;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  size_type sVar4;
  reference vertexArrays_00;
  PrimitiveList local_190;
  VertexArrayBinding local_178;
  VertexArrayBinding local_128;
  VertexArrayBinding local_c8;
  undefined1 local_78 [8];
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> vertexArrays;
  deUint8 indices [6];
  float position [16];
  Quad *quad_local;
  QuadRenderer *this_local;
  
  indices._0_4_ = tcu::Vector<float,_2>::x(&quad->posA);
  register0x00001200 = tcu::Vector<float,_2>::y(&quad->posA);
  tcu::Vector<float,_2>::x(&quad->posA);
  tcu::Vector<float,_2>::y(&quad->posB);
  tcu::Vector<float,_2>::x(&quad->posB);
  tcu::Vector<float,_2>::y(&quad->posA);
  tcu::Vector<float,_2>::x(&quad->posB);
  tcu::Vector<float,_2>::y(&quad->posB);
  vertexArrays.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_2_ = 0x302;
  vertexArrays.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x1010200;
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::vector
            ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)local_78);
  glu::va::Float(&local_c8,this->m_positionLoc,4,4,0,(float *)indices);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::push_back
            ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)local_78,
             &local_c8);
  glu::VertexArrayBinding::~VertexArrayBinding(&local_c8);
  glu::va::Float(&local_128,this->m_colorLoc,4,4,0,quad->color[0].m_data);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::push_back
            ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)local_78,
             &local_128);
  glu::VertexArrayBinding::~VertexArrayBinding(&local_128);
  if ((this->m_blendFuncExt & 1U) != 0) {
    glu::va::Float(&local_178,this->m_color1Loc,4,4,0,quad->color1[0].m_data);
    std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::push_back
              ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)local_78
               ,&local_178);
    glu::VertexArrayBinding::~VertexArrayBinding(&local_178);
  }
  iVar2 = (*this->m_context->_vptr_RenderContext[3])();
  pcVar1 = *(code **)(CONCAT44(extraout_var,iVar2) + 0x1680);
  dVar3 = glu::ShaderProgram::getProgram(this->m_program);
  (*pcVar1)(dVar3);
  context = this->m_context;
  dVar3 = glu::ShaderProgram::getProgram(this->m_program);
  sVar4 = std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::size
                    ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
                     local_78);
  vertexArrays_00 =
       std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::operator[]
                 ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
                  local_78,0);
  glu::pr::Triangles(&local_190,6,
                     (deUint8 *)
                     &vertexArrays.
                      super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  glu::draw(context,dVar3,(int)sVar4,vertexArrays_00,&local_190,(DrawUtilCallback *)0x0);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
            ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)local_78);
  return;
}

Assistant:

void QuadRenderer::render (const Quad& quad) const
{
	const float position[] =
	{
		quad.posA.x(), quad.posA.y(), quad.depth[0], 1.0f,
		quad.posA.x(), quad.posB.y(), quad.depth[1], 1.0f,
		quad.posB.x(), quad.posA.y(), quad.depth[2], 1.0f,
		quad.posB.x(), quad.posB.y(), quad.depth[3], 1.0f
	};
	const deUint8 indices[] = { 0, 2, 1, 1, 2, 3 };

	DE_STATIC_ASSERT(sizeof(tcu::Vec4) == sizeof(float)*4);
	DE_STATIC_ASSERT(sizeof(quad.color) == sizeof(float)*4*4);
	DE_STATIC_ASSERT(sizeof(quad.color1) == sizeof(float)*4*4);

	std::vector<glu::VertexArrayBinding> vertexArrays;

	vertexArrays.push_back(glu::va::Float(m_positionLoc,	4, 4, 0, &position[0]));
	vertexArrays.push_back(glu::va::Float(m_colorLoc,		4, 4, 0, (const float*)&quad.color[0]));

	if (m_blendFuncExt)
		vertexArrays.push_back(glu::va::Float(m_color1Loc,	4, 4, 0, (const float*)&quad.color1[0]));

	m_context.getFunctions().useProgram(m_program->getProgram());
	glu::draw(m_context, m_program->getProgram(),
			  (int)vertexArrays.size(), &vertexArrays[0],
			  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
}